

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out_of_source_main.cpp
# Opt level: O0

bool isRunningInBuildEnvironment(void)

{
  bool bVar1;
  string ending;
  string workingDirectory;
  path *in_stack_fffffffffffffe88;
  allocator *paVar2;
  undefined8 in_stack_fffffffffffffe90;
  string *replaceWith;
  string *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  string local_140 [32];
  string local_120 [8];
  path *in_stack_fffffffffffffee8;
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [39];
  allocator local_91;
  string local_90 [48];
  string local_60 [64];
  string local_20 [32];
  
  replaceWith = local_60;
  ghc::filesystem::path::path<char[2],ghc::filesystem::path>
            ((path *)in_stack_fffffffffffffea0,(char (*) [2])replaceWith,
             (format)((ulong)in_stack_fffffffffffffe90 >> 0x20));
  ghc::filesystem::canonical(in_stack_fffffffffffffee8);
  ghc::filesystem::path::string_abi_cxx11_(in_stack_fffffffffffffe88);
  ghc::filesystem::path::~path((path *)0x11923d);
  ghc::filesystem::path::~path((path *)0x11924a);
  paVar2 = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"examples/out_of_source",paVar2);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::string(local_d8,local_90);
  paVar2 = &local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"/",paVar2);
  ApprovalTests::SystemUtils::getDirectorySeparator_abi_cxx11_();
  ApprovalTests::StringUtils::replaceAll
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,replaceWith);
  std::__cxx11::string::operator=(local_90,local_b8);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::string(local_140,local_20);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffea0,local_90);
  bVar1 = ApprovalTests::StringUtils::endsWith(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffea0);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_20);
  return bVar1;
}

Assistant:

bool isRunningInBuildEnvironment()
{
    auto workingDirectory = fs::canonical(fs::path(".")).string();
    std::string ending = "examples/out_of_source";
    ending = StringUtils::replaceAll(ending, "/", SystemUtils::getDirectorySeparator());
    return StringUtils::endsWith(workingDirectory, ending);
}